

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::round_fp_tex_coords
          (string *__return_storage_ptr__,CompilerMSL *this,string *tex_coords,bool coord_is_fp)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *psStack_20;
  bool coord_is_fp_local;
  string *tex_coords_local;
  CompilerMSL *this_local;
  
  local_21 = coord_is_fp;
  psStack_20 = tex_coords;
  tex_coords_local = (string *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  if (coord_is_fp) {
    ::std::operator+(&local_48,"rint(",tex_coords);
    ::std::operator+(__return_storage_ptr__,&local_48,")");
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)tex_coords);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::round_fp_tex_coords(string tex_coords, bool coord_is_fp)
{
	return coord_is_fp ? ("rint(" + tex_coords + ")") : tex_coords;
}